

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
          (SmallVector<std::__cxx11::string,8ul> *this,char **arg_list_begin,char **arg_list_end)

{
  size_t count;
  size_t sVar1;
  long lVar2;
  allocator local_31;
  
  *(undefined8 *)(this + 8) = 0;
  *(SmallVector<std::__cxx11::string,8ul> **)this = this + 0x18;
  *(undefined8 *)(this + 0x10) = 8;
  count = (long)arg_list_end - (long)arg_list_begin >> 3;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::reserve((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)this,count);
  lVar2 = 0;
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    ::std::__cxx11::string::string
              ((string *)(*(long *)this + lVar2),arg_list_begin[sVar1],&local_31);
    lVar2 = lVar2 + 0x20;
  }
  *(size_t *)(this + 8) = count;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}